

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

xmlAutomataStatePtr
xmlAutomataNewOnceTrans2
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,
          xmlChar *token2,int min,int max,void *data)

{
  xmlRegCounter *pxVar1;
  int iVar2;
  int iVar3;
  xmlRegAtomPtr atom;
  size_t sVar4;
  size_t sVar5;
  xmlChar *__dest;
  
  if ((min <= max &&
       ((0 < min && token != (xmlChar *)0x0) &&
       (from != (xmlAutomataStatePtr)0x0 && am != (xmlAutomataPtr)0x0))) &&
     (atom = xmlRegNewAtom(am,XML_REGEXP_STRING), atom != (xmlRegAtomPtr)0x0)) {
    if ((token2 == (xmlChar *)0x0) || (*token2 == '\0')) {
      __dest = xmlStrdup(token);
    }
    else {
      sVar4 = strlen((char *)token2);
      sVar5 = strlen((char *)token);
      iVar3 = (int)sVar5;
      iVar2 = (int)sVar4;
      __dest = (xmlChar *)(*xmlMallocAtomic)((long)(iVar3 + iVar2 + 2));
      if (__dest == (xmlChar *)0x0) {
        xmlRegFreeAtom(atom);
        return (xmlAutomataStatePtr)0x0;
      }
      memcpy(__dest,token,(long)iVar3);
      __dest[iVar3] = '|';
      memcpy(__dest + (iVar3 + 1),token2,(long)iVar2);
      __dest[(long)(iVar3 + iVar2) + 1] = '\0';
    }
    atom->valuep = __dest;
    atom->data = data;
    atom->quant = XML_REGEXP_QUANT_ONCEONLY;
    atom->min = min;
    atom->max = max;
    iVar3 = xmlRegGetCounter(am);
    pxVar1 = am->counters;
    pxVar1[iVar3].min = 1;
    pxVar1[iVar3].max = 1;
    if (to == (xmlAutomataStatePtr)0x0) {
      to = xmlRegNewState(am);
      xmlRegStatePush(am,to);
    }
    xmlRegStateAddTrans(am,from,atom,to,iVar3,-1);
    xmlRegAtomPush(am,atom);
    am->state = to;
    return to;
  }
  return (xmlAutomataStatePtr)0x0;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewOnceTrans2(xmlAutomataPtr am, xmlAutomataStatePtr from,
			 xmlAutomataStatePtr to, const xmlChar *token,
			 const xmlChar *token2,
			 int min, int max, void *data) {
    xmlRegAtomPtr atom;
    int counter;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    if (min < 1)
	return(NULL);
    if (max < min)
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    if ((token2 == NULL) || (*token2 == 0)) {
	atom->valuep = xmlStrdup(token);
    } else {
	int lenn, lenp;
	xmlChar *str;

	lenn = strlen((char *) token2);
	lenp = strlen((char *) token);

	str = (xmlChar *) xmlMallocAtomic(lenn + lenp + 2);
	if (str == NULL) {
	    xmlRegFreeAtom(atom);
	    return(NULL);
	}
	memcpy(&str[0], token, lenp);
	str[lenp] = '|';
	memcpy(&str[lenp + 1], token2, lenn);
	str[lenn + lenp + 1] = 0;

	atom->valuep = str;
    }
    atom->data = data;
    atom->quant = XML_REGEXP_QUANT_ONCEONLY;
    atom->min = min;
    atom->max = max;
    /*
     * associate a counter to the transition.
     */
    counter = xmlRegGetCounter(am);
    am->counters[counter].min = 1;
    am->counters[counter].max = 1;

    /* xmlFAGenerateTransitions(am, from, to, atom); */
    if (to == NULL) {
	to = xmlRegNewState(am);
	xmlRegStatePush(am, to);
    }
    xmlRegStateAddTrans(am, from, atom, to, counter, -1);
    xmlRegAtomPush(am, atom);
    am->state = to;
    return(to);
}